

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fopen_unchanged.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  FILE *pFVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  int err;
  zip_error_t error;
  
  if (argc == 2) {
    pcVar1 = argv[1];
    lVar5 = zip_open(pcVar1,1,&err);
    pcVar2 = teststr;
    if (lVar5 == 0) {
      zip_error_init_with_code(&error,err);
      pFVar3 = _stderr;
      uVar9 = zip_error_strerror(&error);
      fprintf(pFVar3,"can\'t open zip archive \'%s\': %s\n",pcVar1,uVar9);
      zip_error_fini(&error);
    }
    else {
      sVar6 = strlen(teststr);
      lVar7 = zip_source_buffer(lVar5,pcVar2,sVar6,0);
      pFVar3 = _stderr;
      if (lVar7 == 0) {
        uVar9 = zip_strerror(lVar5);
        fprintf(pFVar3,"can\'t create zip_source from buffer: %s\n",uVar9);
        exit(1);
      }
      lVar8 = zip_add(lVar5,file,lVar7);
      pFVar3 = _stderr;
      pcVar2 = file;
      if (lVar8 == -1) {
        uVar9 = zip_strerror(lVar5);
        fprintf(pFVar3,"can\'t add file \'%s\': %s\n",pcVar2,uVar9);
        zip_source_free(lVar7);
        zip_close(lVar5);
      }
      else {
        lVar7 = zip_fopen(lVar5,file,8);
        pFVar3 = _stderr;
        pcVar2 = file;
        if (lVar7 == 0) {
          uVar9 = zip_strerror(lVar5);
          fprintf(pFVar3,"can\'t zip_fopen file \'%s\': %s\n",pcVar2,uVar9);
          zip_discard(lVar5);
        }
        else {
          iVar4 = zip_close(lVar5);
          pFVar3 = _stderr;
          if (iVar4 != -1) {
            return 0;
          }
          uVar9 = zip_strerror(lVar5);
          fprintf(pFVar3,"can\'t close zip archive \'%s\': %s\n",pcVar1,uVar9);
        }
      }
    }
  }
  else {
    fprintf(_stderr,"usage: %s archive\n",*argv);
  }
  return 1;
}

Assistant:

int
main(int argc, char *argv[]) {
    const char *archive;
    zip_t *za;
    zip_source_t *zs;
    int err;

    if (argc != 2) {
	fprintf(stderr, "usage: %s archive\n", argv[0]);
	return 1;
    }

    archive = argv[1];

    if ((za = zip_open(archive, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "can't open zip archive '%s': %s\n", archive, zip_error_strerror(&error));
	zip_error_fini(&error);
	return 1;
    }

    if ((zs = zip_source_buffer(za, teststr, strlen(teststr), 0)) == NULL) {
	fprintf(stderr, "can't create zip_source from buffer: %s\n", zip_strerror(za));
	exit(1);
    }

    if (zip_add(za, file, zs) == -1) {
	fprintf(stderr, "can't add file '%s': %s\n", file, zip_strerror(za));
	(void)zip_source_free(zs);
	(void)zip_close(za);
	return 1;
    }

    if (zip_fopen(za, file, ZIP_FL_UNCHANGED) == NULL) {
	fprintf(stderr, "can't zip_fopen file '%s': %s\n", file, zip_strerror(za));
	(void)zip_discard(za);
	return 1;
    }

    if (zip_close(za) == -1) {
	fprintf(stderr, "can't close zip archive '%s': %s\n", archive, zip_strerror(za));
	return 1;
    }

    return 0;
}